

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O3

void __thiscall
google::protobuf::descriptor_unittest::AllowUnknownDependenciesTest_CustomOptions_Test::
~AllowUnknownDependenciesTest_CustomOptions_Test
          (AllowUnknownDependenciesTest_CustomOptions_Test *this)

{
  Test *this_00;
  
  this_00 = (Test *)&this[-1].super_AllowUnknownDependenciesTest.db_.files_to_delete_.
                     super__Vector_base<std::unique_ptr<const_google::protobuf::FileDescriptorProto,_std::default_delete<const_google::protobuf::FileDescriptorProto>_>,_std::allocator<std::unique_ptr<const_google::protobuf::FileDescriptorProto,_std::default_delete<const_google::protobuf::FileDescriptorProto>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
  this[-1].super_AllowUnknownDependenciesTest.db_.files_to_delete_.
  super__Vector_base<std::unique_ptr<const_google::protobuf::FileDescriptorProto,_std::default_delete<const_google::protobuf::FileDescriptorProto>_>,_std::allocator<std::unique_ptr<const_google::protobuf::FileDescriptorProto,_std::default_delete<const_google::protobuf::FileDescriptorProto>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)&PTR__AllowUnknownDependenciesTest_01884158;
  (this->super_AllowUnknownDependenciesTest).
  super_TestWithParam<std::tuple<google::protobuf::descriptor_unittest::DescriptorPoolMode,_const_char_*>_>
  .super_Test._vptr_Test = (_func_int **)&DAT_01884198;
  std::
  unique_ptr<google::protobuf::DescriptorPool,_std::default_delete<google::protobuf::DescriptorPool>_>
  ::~unique_ptr((unique_ptr<google::protobuf::DescriptorPool,_std::default_delete<google::protobuf::DescriptorPool>_>
                 *)&(this->super_AllowUnknownDependenciesTest).db_.files_to_delete_.
                    super__Vector_base<std::unique_ptr<const_google::protobuf::FileDescriptorProto,_std::default_delete<const_google::protobuf::FileDescriptorProto>_>,_std::allocator<std::unique_ptr<const_google::protobuf::FileDescriptorProto,_std::default_delete<const_google::protobuf::FileDescriptorProto>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish);
  SimpleDescriptorDatabase::~SimpleDescriptorDatabase
            ((SimpleDescriptorDatabase *)&(this->super_AllowUnknownDependenciesTest).baz_field_);
  testing::Test::~Test(this_00);
  operator_delete(this_00,0xc0);
  return;
}

Assistant:

TEST_P(AllowUnknownDependenciesTest, CustomOptions) {
  // Moo should still have the uninterpreted option attached.
  ASSERT_EQ(1, moo_field_->options().uninterpreted_option_size());
  const UninterpretedOption& option =
      moo_field_->options().uninterpreted_option(0);
  ASSERT_EQ(1, option.name_size());
  EXPECT_EQ("grault", option.name(0).name_part());
}